

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.h
# Opt level: O2

ValVec * __thiscall
dg::llvmdg::InterproceduralNTSCD::getDependencies
          (ValVec *__return_storage_ptr__,InterproceduralNTSCD *this,BasicBlock *b)

{
  iterator iVar1;
  _Rb_tree_node_base *p_Var2;
  CDNode *block;
  set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_> ret;
  Value *local_70;
  CDNode *local_68;
  _Rb_tree<llvm::Value_*,_llvm::Value_*,_std::_Identity<llvm::Value_*>,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
  local_60;
  
  if ((this->super_LLVMControlDependenceAnalysisImpl)._options.
      super_ControlDependenceAnalysisOptions.field_0x3d != '\x01') {
    _compute(this);
    local_68 = ICDGraphBuilder::getNode(&this->igraphBuilder,(Value *)b);
    if ((local_68 != (CDNode *)0x0) &&
       (iVar1 = std::
                _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                ::find(&(this->controlDependence)._M_t,&local_68),
       (_Rb_tree_header *)iVar1._M_node !=
       &(this->controlDependence)._M_t._M_impl.super__Rb_tree_header)) {
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var2 = *(_Rb_tree_node_base **)(iVar1._M_node + 2);
          p_Var2 != (_Rb_tree_node_base *)&iVar1._M_node[1]._M_left;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        local_70 = ICDGraphBuilder::getValue(&this->igraphBuilder,*(CDNode **)(p_Var2 + 1));
        std::
        _Rb_tree<llvm::Value*,llvm::Value*,std::_Identity<llvm::Value*>,std::less<llvm::Value*>,std::allocator<llvm::Value*>>
        ::_M_insert_unique<llvm::Value*>
                  ((_Rb_tree<llvm::Value*,llvm::Value*,std::_Identity<llvm::Value*>,std::less<llvm::Value*>,std::allocator<llvm::Value*>>
                    *)&local_60,&local_70);
      }
      (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
      _M_range_initialize<std::_Rb_tree_const_iterator<llvm::Value*>>
                ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)__return_storage_ptr__,
                 local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                 &local_60._M_impl.super__Rb_tree_header);
      std::
      _Rb_tree<llvm::Value_*,_llvm::Value_*,_std::_Identity<llvm::Value_*>,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
      ::~_Rb_tree(&local_60);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

ValVec getDependencies(const llvm::BasicBlock *b) override {
        if (getOptions().nodePerInstruction()) {
            return {};
        }

        _compute();

        auto *block = igraphBuilder.getNode(b);
        if (!block) {
            return {};
        }

        assert(_computed && "Did not compute CD");
        auto dit = controlDependence.find(block);
        if (dit == controlDependence.end())
            return {};

        std::set<llvm::Value *> ret;
        for (auto *dep : dit->second) {
            const auto *val = igraphBuilder.getValue(dep);
            assert(val && "Invalid value");
            ret.insert(const_cast<llvm::Value *>(val));
        }

        return ValVec{ret.begin(), ret.end()};
    }